

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser-internal.h
# Opt level: O2

void __thiscall
wasm::WATParser::WithPosition<wasm::WATParser::ParseModuleTypesCtx>::WithPosition
          (WithPosition<wasm::WATParser::ParseModuleTypesCtx> *this,ParseModuleTypesCtx *ctx,
          Index pos)

{
  pointer pAVar1;
  
  this->ctx = ctx;
  this->original = (Index)(ctx->in).pos;
  pAVar1 = (ctx->in).annotations.
           super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->annotations).
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (ctx->in).annotations.
       super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->annotations).
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_finish = pAVar1;
  (this->annotations).
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (ctx->in).annotations.
       super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (ctx->in).annotations.
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (ctx->in).annotations.
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (ctx->in).annotations.
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (ctx->in).pos = (ulong)pos;
  Lexer::advance(&ctx->in);
  return;
}

Assistant:

WithPosition(Ctx& ctx, Index pos)
    : ctx(ctx), original(ctx.in.getPos()),
      annotations(ctx.in.takeAnnotations()) {
    ctx.in.setPos(pos);
  }